

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O0

UBool __thiscall
icu_63::RuleBasedBreakIterator::BreakCache::populateNear
          (BreakCache *this,int32_t position,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  int64_t iVar3;
  int32_t local_30;
  int32_t backupPos;
  int32_t ruleStatusIndex;
  int32_t aBoundary;
  UErrorCode *status_local;
  int32_t position_local;
  BreakCache *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if ((position < this->fBoundaries[this->fStartBufIdx] + -0xf) ||
       (this->fBoundaries[this->fEndBufIdx] + 0xf < position)) {
      backupPos = 0;
      local_30 = 0;
      if ((0x14 < position) && (iVar2 = handleSafePrevious(this->fBI,position), 0 < iVar2)) {
        this->fBI->fPosition = iVar2;
        backupPos = handleNext(this->fBI);
        if (backupPos <= iVar2 + 4) {
          utext_setNativeIndex_63(&this->fBI->fText,(long)backupPos);
          iVar3 = utext_getPreviousNativeIndex_63(&this->fBI->fText);
          if (iVar2 == iVar3) {
            backupPos = handleNext(this->fBI);
          }
        }
        local_30 = this->fBI->fRuleStatusIndex;
      }
      reset(this,backupPos,local_30);
    }
    if (this->fBoundaries[this->fEndBufIdx] < position) {
      do {
        if (position <= this->fBoundaries[this->fEndBufIdx]) {
          this->fBufIdx = this->fEndBufIdx;
          this->fTextIdx = this->fBoundaries[this->fBufIdx];
          while (position < this->fTextIdx) {
            previous(this,status);
          }
          return '\x01';
        }
        UVar1 = populateFollowing(this);
      } while (UVar1 != '\0');
      this_local._7_1_ = '\0';
    }
    else if (position < this->fBoundaries[this->fStartBufIdx]) {
      while (position < this->fBoundaries[this->fStartBufIdx]) {
        populatePreceding(this,status);
      }
      this->fBufIdx = this->fStartBufIdx;
      this->fTextIdx = this->fBoundaries[this->fBufIdx];
      while (this->fTextIdx < position) {
        next(this);
      }
      if (position < this->fTextIdx) {
        previous(this,status);
      }
      this_local._7_1_ = '\x01';
    }
    else {
      this_local._7_1_ = '\x01';
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool RuleBasedBreakIterator::BreakCache::populateNear(int32_t position, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return FALSE;
    }
    U_ASSERT(position < fBoundaries[fStartBufIdx] || position > fBoundaries[fEndBufIdx]);

    // Find a boundary somewhere in the vicinity of the requested position.
    // Depending on the safe rules and the text data, it could be either before, at, or after
    // the requested position.


    // If the requested position is not near already cached positions, clear the existing cache,
    // find a near-by boundary and begin new cache contents there.

    if ((position < fBoundaries[fStartBufIdx] - 15) || position > (fBoundaries[fEndBufIdx] + 15)) {
        int32_t aBoundary = 0;
        int32_t ruleStatusIndex = 0;
        if (position > 20) {
            int32_t backupPos = fBI->handleSafePrevious(position);

            if (backupPos > 0) {
                // Advance to the boundary following the backup position.
                // There is a complication: the safe reverse rules identify pairs of code points
                // that are safe. If advancing from the safe point moves forwards by less than
                // two code points, we need to advance one more time to ensure that the boundary
                // is good, including a correct rules status value.
                //
                fBI->fPosition = backupPos;
                aBoundary = fBI->handleNext();
                if (aBoundary <= backupPos + 4) {
                    // +4 is a quick test for possibly having advanced only one codepoint.
                    // Four being the length of the longest potential code point, a supplementary in UTF-8
                    utext_setNativeIndex(&fBI->fText, aBoundary);
                    if (backupPos == utext_getPreviousNativeIndex(&fBI->fText)) {
                        // The initial handleNext() only advanced by a single code point. Go again.
                        aBoundary = fBI->handleNext();   // Safe rules identify safe pairs.
                    }
                }
                ruleStatusIndex = fBI->fRuleStatusIndex;
            }
        }
        reset(aBoundary, ruleStatusIndex);        // Reset cache to hold aBoundary as a single starting point.
    }

    // Fill in boundaries between existing cache content and the new requested position.

    if (fBoundaries[fEndBufIdx] < position) {
        // The last position in the cache precedes the requested position.
        // Add following position(s) to the cache.
        while (fBoundaries[fEndBufIdx] < position) {
            if (!populateFollowing()) {
                U_ASSERT(false);
                return false;
            }
        }
        fBufIdx = fEndBufIdx;                      // Set iterator position to the end of the buffer.
        fTextIdx = fBoundaries[fBufIdx];           // Required because populateFollowing may add extra boundaries.
        while (fTextIdx > position) {              // Move backwards to a position at or preceding the requested pos.
            previous(status);
        }
        return true;
    }

    if (fBoundaries[fStartBufIdx] > position) {
        // The first position in the cache is beyond the requested position.
        // back up more until we get a boundary <= the requested position.
        while (fBoundaries[fStartBufIdx] > position) {
            populatePreceding(status);
        }
        fBufIdx = fStartBufIdx;                    // Set iterator position to the start of the buffer.
        fTextIdx = fBoundaries[fBufIdx];           // Required because populatePreceding may add extra boundaries.
        while (fTextIdx < position) {              // Move forwards to a position at or following the requested pos.
            next();
        }
        if (fTextIdx > position) {
            // If position is not itself a boundary, the next() loop above will overshoot.
            // Back up one, leaving cache position at the boundary preceding the requested position.
            previous(status);
        }
        return true;
    }

    U_ASSERT(fTextIdx == position);
    return true;
}